

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall
ghc::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  char *__n;
  long lVar1;
  bool bVar2;
  impl_string_type *piVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  path *element;
  format fVar9;
  ulong uVar11;
  const_iterator cVar12;
  iterator __begin2;
  iterator __end2;
  const_iterator a;
  const_iterator b;
  const_iterator local_2d0;
  long local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  path *local_2b0;
  impl_string_type *local_2a8;
  path *local_2a0;
  undefined1 local_298 [32];
  _Alloc_hider local_278;
  size_t local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 local_258 [32];
  _Alloc_hider local_238;
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  impl_string_type local_1d8;
  undefined1 local_1b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  long *local_178 [2];
  long local_168 [3];
  undefined1 local_150 [32];
  _Alloc_hider local_130;
  size_t local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  impl_string_type local_110;
  iterator local_f0;
  iterator local_b0;
  iterator local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  
  local_2a0 = this;
  root_name((path *)local_258,this);
  local_2b0 = base;
  root_name((path *)local_150,base);
  __n = (char *)CONCAT44(local_258._12_4_,local_258._8_4_);
  if ((__n == (char *)local_150._8_8_) &&
     ((__n == (char *)0x0 ||
      (iVar7 = bcmp((void *)local_258._0_8_,(void *)local_150._0_8_,(size_t)__n), iVar7 == 0)))) {
    bVar5 = has_root_directory(local_2a0);
    bVar6 = has_root_directory(local_2b0);
    if (bVar5 == bVar6) {
      bVar5 = has_root_directory(local_2a0);
      if (bVar5) {
        if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
          operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
        }
        if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
          operator_delete((void *)local_258._0_8_,CONCAT44(local_258._20_4_,local_258._16_4_) + 1);
        }
LAB_001547ed:
        local_258._0_8_ = (local_2a0->_path)._M_dataplus._M_p;
        local_f0._first._M_current = (char *)(local_258._0_8_ + (local_2a0->_path)._M_string_length)
        ;
        local_2a8 = &__return_storage_ptr__->_path;
        local_70._first._M_current = (char *)local_258._0_8_;
        iterator::iterator((iterator *)local_150,(const_iterator *)local_258,&local_f0._first,
                           &local_70._first);
        local_258._0_8_ = (local_2b0->_path)._M_dataplus._M_p;
        local_70._first._M_current = (char *)(local_258._0_8_ + (local_2b0->_path)._M_string_length)
        ;
        local_b0._first._M_current = (char *)local_258._0_8_;
        iterator::iterator(&local_f0,(const_iterator *)local_258,&local_70._first,&local_b0._first);
        do {
          local_b0._first._M_current = (local_2a0->_path)._M_dataplus._M_p;
          local_298._0_8_ = local_b0._first._M_current + (local_2a0->_path)._M_string_length;
          local_198._M_allocated_capacity = local_298._0_8_;
          iterator::iterator((iterator *)local_258,&local_b0._first,(const_iterator *)local_298,
                             (const_iterator *)&local_198._M_allocated_capacity);
          uVar4 = local_150._24_8_;
          lVar1 = CONCAT44(local_258._28_4_,local_258._24_4_);
          if (local_150._24_8_ == lVar1) {
LAB_00154958:
            bVar5 = false;
          }
          else {
            local_b0._first._M_current = (local_2b0->_path)._M_dataplus._M_p;
            local_298._0_8_ = local_b0._first._M_current + (local_2b0->_path)._M_string_length;
            local_198._M_allocated_capacity = local_298._0_8_;
            iterator::iterator(&local_70,&local_b0._first,(const_iterator *)local_298,
                               (const_iterator *)&local_198._M_allocated_capacity);
            if ((local_f0._iter._M_current == local_70._iter._M_current) ||
               (local_128 != local_f0._current._path._M_string_length)) goto LAB_00154958;
            if (local_128 == 0) {
              bVar5 = true;
            }
            else {
              iVar7 = bcmp(local_130._M_p,local_f0._current._path._M_dataplus._M_p,local_128);
              bVar5 = iVar7 == 0;
            }
          }
          if ((uVar4 != lVar1) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2)) {
            operator_delete(local_70._current._path._M_dataplus._M_p,
                            local_70._current._path.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_p != &local_228) {
            operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
          }
          if (!bVar5) goto LAB_001549d3;
          iterator::operator++((iterator *)local_150);
          iterator::operator++(&local_f0);
        } while( true );
      }
      bVar5 = has_root_directory(local_2b0);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
        operator_delete((void *)local_258._0_8_,CONCAT44(local_258._20_4_,local_258._16_4_) + 1);
      }
      if (!bVar5) goto LAB_001547ed;
      goto LAB_0015471c;
    }
  }
  if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
    operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
  }
  if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
    operator_delete((void *)local_258._0_8_,CONCAT44(local_258._20_4_,local_258._16_4_) + 1);
  }
LAB_0015471c:
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
LAB_001549d3:
  local_b0._first._M_current = (local_2a0->_path)._M_dataplus._M_p;
  local_298._0_8_ = local_b0._first._M_current + (local_2a0->_path)._M_string_length;
  local_198._M_allocated_capacity = local_298._0_8_;
  iterator::iterator((iterator *)local_258,&local_b0._first,(const_iterator *)local_298,
                     (const_iterator *)&local_198._M_allocated_capacity);
  if (local_150._24_8_ == CONCAT44(local_258._28_4_,local_258._24_4_)) {
    local_298._0_8_ = (local_2b0->_path)._M_dataplus._M_p;
    local_2d0._M_current = (char *)(local_298._0_8_ + (local_2b0->_path)._M_string_length);
    local_198._M_allocated_capacity = (size_type)local_2d0._M_current;
    iterator::iterator(&local_b0,(const_iterator *)local_298,
                       (const_iterator *)&local_198._M_allocated_capacity,&local_2d0);
    piVar3 = local_2a8;
    bVar5 = local_f0._iter._M_current == local_b0._iter._M_current;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._current._path._M_dataplus._M_p != &local_b0._current._path.field_2) {
      operator_delete(local_b0._current._path._M_dataplus._M_p,
                      local_b0._current._path.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar5 = false;
    piVar3 = local_2a8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_p != &local_228) {
    operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
  }
  if (bVar5) {
    local_258._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_258 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,".","");
    (piVar3->_M_dataplus)._M_p = (pointer)&piVar3->field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)piVar3,local_258._0_8_,
               (char *)(local_258._0_8_ + CONCAT44(local_258._12_4_,local_258._8_4_)));
    fVar9 = (format)paVar10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_258 + 0x10)) {
      uVar11 = CONCAT44(local_258._20_4_,local_258._16_4_) + 1;
      operator_delete((void *)local_258._0_8_,uVar11);
      fVar9 = (format)uVar11;
    }
    postprocess_path_with_format(piVar3,fVar9);
  }
  else {
    local_198._M_allocated_capacity = (size_type)(local_2b0->_path)._M_dataplus._M_p;
    local_2d0._M_current =
         (char *)(local_198._M_allocated_capacity + (local_2b0->_path)._M_string_length);
    local_1d8._M_dataplus._M_p = local_2d0._M_current;
    iterator::iterator((iterator *)local_298,(const_iterator *)&local_198._M_allocated_capacity,
                       &local_2d0,(const_iterator *)&local_1d8);
    input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
              ((input_iterator_range<ghc::filesystem::path::iterator> *)local_258,&local_f0,
               (iterator *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    local_298._16_4_ = local_258._16_4_;
    local_298._20_4_ = local_258._20_4_;
    local_298._24_4_ = local_258._24_4_;
    local_298._28_4_ = local_258._28_4_;
    local_298._0_8_ = local_258._0_8_;
    local_298._8_4_ = local_258._8_4_;
    local_298._12_4_ = local_258._12_4_;
    local_278._M_p = (pointer)&local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,local_238._M_p,local_238._M_p + local_230);
    local_188 = local_208;
    uStack_184 = uStack_204;
    uStack_180 = uStack_200;
    uStack_17c = uStack_1fc;
    local_198._M_allocated_capacity._4_4_ = uStack_214;
    local_198._M_allocated_capacity._0_4_ = local_218;
    local_198._8_4_ = uStack_210;
    local_198._12_4_ = uStack_20c;
    local_178[0] = local_168;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_178,local_1f8._M_p,local_1f8._M_p + local_1f0);
    paVar10 = &local_1d8.field_2;
    local_2b0 = (path *)(local_1b8 + 0x10);
    iVar7 = 0;
    while( true ) {
      if (CONCAT44(local_298._28_4_,local_298._24_4_) == CONCAT44(uStack_17c,uStack_180)) break;
      local_2d0._M_current = (char *)&local_2c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,".","");
      cVar12._M_current = local_2d0._M_current;
      local_1d8._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_1d8,local_2d0._M_current,local_2d0._M_current + local_2c8);
      fVar9 = (format)cVar12._M_current;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_current != &local_2c0) {
        uVar11 = local_2c0._M_allocated_capacity + 1;
        operator_delete(local_2d0._M_current,uVar11);
        fVar9 = (format)uVar11;
      }
      postprocess_path_with_format(&local_1d8,fVar9);
      bVar5 = true;
      if (local_270 == local_1d8._M_string_length) {
        if (local_270 == 0) {
          bVar5 = false;
        }
        else {
          iVar8 = bcmp(local_278._M_p,local_1d8._M_dataplus._M_p,local_270);
          bVar5 = iVar8 != 0;
        }
      }
      if (bVar5) {
        local_2d0._M_current = (char *)&local_2c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
        local_1b8._0_8_ = local_1b8 + 0x10;
        cVar12._M_current = local_2d0._M_current;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_1b8,local_2d0._M_current,local_2d0._M_current + local_2c8);
        fVar9 = (format)cVar12._M_current;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_current != &local_2c0) {
          uVar11 = local_2c0._M_allocated_capacity + 1;
          operator_delete(local_2d0._M_current,uVar11);
          fVar9 = (format)uVar11;
        }
        postprocess_path_with_format((impl_string_type *)local_1b8,fVar9);
        if ((local_270 == local_1b8._8_8_) &&
           ((local_270 == 0 ||
            (iVar8 = bcmp(local_278._M_p,(void *)local_1b8._0_8_,local_270), iVar8 == 0))))
        goto LAB_00154e1c;
        local_2d0._M_current = (char *)&local_2c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"..","");
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        cVar12._M_current = local_2d0._M_current;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_110,local_2d0._M_current,local_2d0._M_current + local_2c8);
        fVar9 = (format)cVar12._M_current;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_current != &local_2c0) {
          uVar11 = local_2c0._M_allocated_capacity + 1;
          operator_delete(local_2d0._M_current,uVar11);
          fVar9 = (format)uVar11;
        }
        postprocess_path_with_format(&local_110,fVar9);
        bVar2 = true;
        if (local_270 == local_110._M_string_length) {
          bVar6 = true;
          if (local_270 != 0) {
            iVar8 = bcmp(local_278._M_p,local_110._M_dataplus._M_p,local_270);
            bVar6 = iVar8 != 0;
            goto LAB_00154e21;
          }
          goto LAB_00154e1e;
        }
        bVar6 = true;
      }
      else {
LAB_00154e1c:
        bVar6 = false;
LAB_00154e1e:
        bVar2 = bVar6;
        bVar6 = false;
      }
LAB_00154e21:
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2)) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((bVar5) && ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar10) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        iVar7 = iVar7 + 1;
      }
      else {
        local_2d0._M_current = (char *)&local_2c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"..","");
        cVar12._M_current = local_2d0._M_current;
        local_1d8._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_1d8,local_2d0._M_current,local_2d0._M_current + local_2c8);
        fVar9 = (format)cVar12._M_current;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_current != &local_2c0) {
          uVar11 = local_2c0._M_allocated_capacity + 1;
          operator_delete(local_2d0._M_current,uVar11);
          fVar9 = (format)uVar11;
        }
        postprocess_path_with_format(&local_1d8,fVar9);
        iVar8 = 0;
        if (local_270 == local_1d8._M_string_length) {
          if (local_270 == 0) {
            iVar8 = -1;
          }
          else {
            iVar8 = bcmp(local_278._M_p,local_1d8._M_dataplus._M_p,local_270);
            iVar8 = -(uint)(iVar8 == 0);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar10) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        iVar7 = iVar7 + iVar8;
      }
      iterator::operator++((iterator *)local_298);
    }
    if (local_178[0] != local_168) {
      operator_delete(local_178[0],local_168[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_p != &local_1e8) {
      operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_p != &local_228) {
      operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
    }
    (local_2a8->_M_dataplus)._M_p = (pointer)&local_2a8->field_2;
    local_2a8->_M_string_length = 0;
    (local_2a8->field_2)._M_local_buf[0] = '\0';
    if (-1 < iVar7) {
      for (; iVar7 != 0; iVar7 = iVar7 + -1) {
        append<char[3]>((path *)local_2a8,(char (*) [3])"..");
      }
      local_198._M_allocated_capacity = (size_type)(local_2a0->_path)._M_dataplus._M_p;
      local_2d0._M_current =
           (char *)(local_198._M_allocated_capacity + (local_2a0->_path)._M_string_length);
      local_1d8._M_dataplus._M_p = local_2d0._M_current;
      iterator::iterator((iterator *)local_298,(const_iterator *)&local_198._M_allocated_capacity,
                         &local_2d0,(const_iterator *)&local_1d8);
      input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                ((input_iterator_range<ghc::filesystem::path::iterator> *)local_258,
                 (iterator *)local_150,(iterator *)local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_p != &local_268) {
        operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
      }
      local_298._16_4_ = local_258._16_4_;
      local_298._20_4_ = local_258._20_4_;
      local_298._24_4_ = local_258._24_4_;
      local_298._28_4_ = local_258._28_4_;
      local_298._0_8_ = local_258._0_8_;
      local_298._8_4_ = local_258._8_4_;
      local_298._12_4_ = local_258._12_4_;
      local_278._M_p = (pointer)&local_268;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,local_238._M_p,local_238._M_p + local_230);
      local_188 = local_208;
      uStack_184 = uStack_204;
      uStack_180 = uStack_200;
      uStack_17c = uStack_1fc;
      local_198._M_allocated_capacity._4_4_ = uStack_214;
      local_198._M_allocated_capacity._0_4_ = local_218;
      local_198._8_4_ = uStack_210;
      local_198._12_4_ = uStack_20c;
      local_178[0] = local_168;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_178,local_1f8._M_p,local_1f8._M_p + local_1f0);
      while (CONCAT44(local_298._28_4_,local_298._24_4_) != CONCAT44(uStack_17c,uStack_180)) {
        operator/=((path *)local_2a8,(path *)&local_278);
        iterator::operator++((iterator *)local_298);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0],local_168[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_p != &local_268) {
        operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_p != &local_1e8) {
        operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_p != &local_228) {
        operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._current._path._M_dataplus._M_p != &local_f0._current._path.field_2) {
    operator_delete(local_f0._current._path._M_dataplus._M_p,
                    local_f0._current._path.field_2._M_allocated_capacity + 1);
  }
  piVar3 = local_2a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p == &local_120) {
    return (path *)local_2a8;
  }
  operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  return (path *)piVar3;
}

Assistant:

GHC_INLINE path path::lexically_relative(const path& base) const
{
    if (root_name() != base.root_name() || is_absolute() != base.is_absolute() || (!has_root_directory() && base.has_root_directory())) {
        return path();
    }
    const_iterator a = begin(), b = base.begin();
    while (a != end() && b != base.end() && *a == *b) {
        ++a;
        ++b;
    }
    if (a == end() && b == base.end()) {
        return path(".");
    }
    int count = 0;
    for (const auto& element : input_iterator_range<const_iterator>(b, base.end())) {
        if (element != "." && element != "" && element != "..") {
            ++count;
        }
        else if (element == "..") {
            --count;
        }
    }
    if (count < 0) {
        return path();
    }
    path result;
    for (int i = 0; i < count; ++i) {
        result /= "..";
    }
    for (const auto& element : input_iterator_range<const_iterator>(a, end())) {
        result /= element;
    }
    return result;
}